

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_hpf1_get_heap_size(ma_hpf1_config *pConfig,size_t *pHeapSizeInBytes)

{
  undefined8 *in_RSI;
  ma_hpf1_heap_layout heapLayout;
  ma_result result;
  ma_hpf1_config *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined4 local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    local_4 = ma_hpf1_get_heap_layout(in_stack_ffffffffffffffc8,(ma_hpf1_heap_layout *)0x1c087f);
    if (local_4 == MA_SUCCESS) {
      *in_RSI = local_30;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_hpf1_get_heap_size(const ma_hpf1_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_hpf1_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_hpf1_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}